

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

ch_string * ch_substring(ch_context *vm,ch_string *target,size_t start,size_t end)

{
  char *value;
  ch_string *pcVar1;
  size_t __n;
  
  __n = end - start;
  if ((start <= end && __n != 0) && (end <= target->size)) {
    value = (char *)malloc(__n + 1);
    memcpy(value,target->value + start,__n);
    value[__n] = '\0';
    pcVar1 = register_allocated_string(vm,value,__n);
    return pcVar1;
  }
  return (ch_string *)0x0;
}

Assistant:

ch_string *ch_substring(ch_context *vm, ch_string* target, size_t start, size_t end) {
  if (end <= start || start >= target->size || end > target->size) return NULL;
  size_t size = end - start;
  char *value = (char*) malloc(size + 1);
  memcpy(value, &target->value[start], size);
  value[size] = '\0';

  return register_allocated_string(vm, value, size);
}